

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O1

void CoreMLConverter::convertCaffeMetadata
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *bottom,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *top,RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *nnWrite,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *mappingDataBlobNames)

{
  string *psVar1;
  pointer pbVar2;
  size_t sVar3;
  pointer pcVar4;
  uint uVar5;
  int iVar6;
  Type *this;
  iterator iVar7;
  key_type *pkVar8;
  Type *this_00;
  LogMessage *other;
  undefined8 *puVar9;
  long *plVar10;
  ostream *poVar11;
  Type *pTVar12;
  runtime_error *prVar13;
  uint uVar14;
  long *plVar15;
  ulong uVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  uint uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  pointer pbVar18;
  uint uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input_1;
  string *value;
  string *value_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  inputs;
  string __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  stringstream ss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  long *local_290;
  undefined8 local_288;
  long local_280;
  undefined8 uStack_278;
  ulong local_270;
  ulong *local_268;
  long local_260;
  ulong local_258 [2];
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  string *local_210;
  ulong local_208;
  RepeatedPtrFieldBase *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  LogMessage local_1f0;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  
  uVar17 = (nnWrite->super_RepeatedPtrFieldBase).current_size_;
  local_208 = (ulong)uVar17;
  uVar17 = uVar17 - 1;
  local_270 = (ulong)uVar17;
  local_200 = &nnWrite->super_RepeatedPtrFieldBase;
  local_1f8 = top;
  this = google::protobuf::internal::RepeatedPtrFieldBase::
         Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                   (&nnWrite->super_RepeatedPtrFieldBase,uVar17);
  psVar1 = (this->name_).ptr_;
  local_210 = name;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,name);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  pbVar18 = (bottom->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (bottom->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar18 != pbVar2) {
    do {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&mappingDataBlobNames->_M_t,pbVar18);
      pkVar8 = pbVar18;
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(mappingDataBlobNames->_M_t)._M_impl.super__Rb_tree_header) {
        pkVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](mappingDataBlobNames,pbVar18);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_2a8,pkVar8);
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar2);
  }
  pbVar18 = (local_1f8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (local_1f8->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar18 != pbVar2) {
    do {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&mappingDataBlobNames->_M_t,pbVar18);
      pkVar8 = pbVar18;
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(mappingDataBlobNames->_M_t)._M_impl.super__Rb_tree_header) {
        pkVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](mappingDataBlobNames,pbVar18);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_228,pkVar8);
      pbVar18 = pbVar18 + 1;
    } while (pbVar18 != pbVar2);
  }
  value = local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((((long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_228.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)local_2a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_2a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) ||
      (sVar3 = (local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
      sVar3 != (local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)) ||
     ((sVar3 != 0 &&
      (iVar6 = bcmp(((local_228.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                    ((local_2a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,sVar3),
      value = local_2a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start,
      psVar1 = local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, iVar6 != 0)))) goto LAB_003ddb32;
  if ((int)local_270 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,
               "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names."
               ,0x9a);
    std::endl<char,std::char_traits<char>>((ostream *)&local_1a8);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_1f0);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_200,(int)local_208 + -2);
  if ((this_00->output_).super_RepeatedPtrFieldBase.current_size_ != 1) {
LAB_003ddb95:
    std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Current layer\'s (\'",0x12);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,(local_210->_M_dataplus)._M_p,
                         local_210->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\') input name (\'",0x10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,((local_2a8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                         (local_2a8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"\') does not match previous layer\'s (\'",0x25);
    psVar1 = (this_00->name_).ptr_;
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\') output name (\'",0x11);
    pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (&(this_00->output_).super_RepeatedPtrFieldBase,0);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(pTVar12->_M_dataplus)._M_p,pTVar12->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,")\'",2);
    std::endl<char,std::char_traits<char>>(poVar11);
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar13,(string *)&local_290);
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this_00->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1b8,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
  }
  pbVar18 = local_2a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (undefined8 *)((this_00->output_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  sVar3 = puVar9[1];
  if ((sVar3 != (local_2a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length) ||
     ((sVar3 != 0 &&
      (iVar6 = bcmp((void *)*puVar9,
                    ((local_2a8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,sVar3),
      iVar6 != 0)))) goto LAB_003ddb95;
  local_248 = local_238;
  pcVar4 = (pbVar18->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar4,pcVar4 + pbVar18->_M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  uVar19 = (uint)local_270;
  uVar17 = -uVar19;
  if (0 < (int)uVar19) {
    uVar17 = uVar19;
  }
  uVar19 = 1;
  if (9 < uVar17) {
    uVar16 = (ulong)uVar17;
    uVar5 = 4;
    do {
      uVar19 = uVar5;
      uVar14 = (uint)uVar16;
      if (uVar14 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_003dd94c;
      }
      if (uVar14 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_003dd94c;
      }
      if (uVar14 < 10000) goto LAB_003dd94c;
      uVar16 = uVar16 / 10000;
      uVar5 = uVar19 + 4;
    } while (99999 < uVar14);
    uVar19 = uVar19 + 1;
  }
LAB_003dd94c:
  uVar16 = local_270 >> 0x1f;
  local_268 = local_258;
  std::__cxx11::string::_M_construct
            ((ulong)&local_268,(char)uVar19 - ((char)(local_270 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((uVar16 & 1) + (long)local_268),uVar19,uVar17);
  uVar16 = 0xf;
  if (local_248 != local_238) {
    uVar16 = local_238[0];
  }
  if (uVar16 < (ulong)(local_260 + local_240)) {
    uVar16 = 0xf;
    if (local_268 != local_258) {
      uVar16 = local_258[0];
    }
    if (uVar16 < (ulong)(local_260 + local_240)) goto LAB_003dd9ca;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,(ulong)local_248);
  }
  else {
LAB_003dd9ca:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_268);
  }
  local_290 = &local_280;
  plVar10 = puVar9 + 2;
  if ((long *)*puVar9 == plVar10) {
    local_280 = *plVar10;
    uStack_278 = puVar9[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*puVar9;
  }
  local_288 = puVar9[1];
  *puVar9 = plVar10;
  puVar9[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_290,(ulong)(local_210->_M_dataplus)._M_p);
  plVar15 = plVar10 + 2;
  if ((long *)*plVar10 == plVar15) {
    local_1a8 = *plVar15;
    lStack_1a0 = plVar10[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar15;
    local_1b8 = (long *)*plVar10;
  }
  local_1b0 = plVar10[1];
  *plVar10 = (long)plVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=
            ((string *)
             local_2a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,(string *)&local_1b8);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_268 != local_258) {
    operator_delete(local_268,local_258[0] + 1);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this_00->output_).super_RepeatedPtrFieldBase);
  CoreML::Specification::NeuralNetworkLayer::add_output
            (this_00,local_2a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  value = local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = local_2a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
LAB_003ddb32:
  for (; pbVar18 = local_228.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      value_00 = local_228.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, value != psVar1; value = value + 1) {
    CoreML::Specification::NeuralNetworkLayer::add_input(this,value);
  }
  for (; value_00 != pbVar18; value_00 = value_00 + 1) {
    CoreML::Specification::NeuralNetworkLayer::add_output(this,value_00);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a8);
  return;
}

Assistant:

inline void convertCaffeMetadata(const std::string& name,
                                     const std::vector<std::string>& bottom,
                                     const std::vector<std::string>& top,
                                     ::google::protobuf::RepeatedPtrField< ::CoreML::Specification::NeuralNetworkLayer >* nnWrite,
                                     std::map<std::string, std::string>& mappingDataBlobNames) {
        
        int currentLayerNumber = nnWrite->size() - 1;
        CoreML::Specification::NeuralNetworkLayer* specLayer = nnWrite->Mutable(currentLayerNumber);
        
        //set name
        specLayer->set_name(name);
        
        //get inputs and outputs
        std::vector<std::string> inputs;
        std::vector<std::string> outputs;
        for (const auto& input: bottom) {
            if(mappingDataBlobNames.find(input) == mappingDataBlobNames.end()){
                inputs.push_back(input);
            } else {
                inputs.push_back(mappingDataBlobNames[input]);
            }
        }
        for (const auto& output: top) {
            if(mappingDataBlobNames.find(output) == mappingDataBlobNames.end()){
                outputs.push_back(output);
            } else {
                outputs.push_back(mappingDataBlobNames[output]);
            }
        }
        
        if (outputs.size() == inputs.size() == 1 && outputs[0]==inputs[0]) {
            if (currentLayerNumber == 0) {
                std::stringstream ss;
                ss << "CoreML Specification requires unique input and output names for each layer. First layer of the caffe network cannot have identical input and output names." << std::endl;
                throw std::runtime_error(ss.str());
            } else {
                CoreML::Specification::NeuralNetworkLayer* previousSpecLayer = nnWrite->Mutable(currentLayerNumber-1);
                if (previousSpecLayer->output_size()!=1 || previousSpecLayer->output(0)!=inputs[0]){
                    std::stringstream ss;
                    ss << "Current layer's ('" << name << "') input name ('" << inputs[0] << "') does not match previous layer's ('" ;
                    ss << previousSpecLayer->name() << "') output name ('" << previousSpecLayer->output(0) <<")'" << std::endl;
                    throw std::runtime_error(ss.str());
                } else {
                    inputs[0] = inputs[0] + "_" + std::to_string(currentLayerNumber) + name;
                    previousSpecLayer->clear_output();
                    previousSpecLayer->add_output(inputs[0]);
                }
            }
        }
        
        // set input names
        for (const auto& input: inputs) {
            specLayer->add_input(input);
        }
        
        //set output names
        for (const auto& output: outputs) {
            specLayer->add_output(output);
        }

    }